

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeSorterJoinThread(SortSubtask *pTask)

{
  SQLiteThread *p;
  void *pRet;
  void *local_18;
  
  p = pTask->pThread;
  if (p == (SQLiteThread *)0x0) {
    local_18._0_4_ = 0;
  }
  else {
    local_18 = (void *)0x1;
    if (p->done == 0) {
      pthread_join(p->tid,&local_18);
    }
    else {
      local_18 = p->pOut;
    }
    sqlite3_free(p);
    pTask->bDone = 0;
    pTask->pThread = (SQLiteThread *)0x0;
  }
  return (int)local_18;
}

Assistant:

static int vdbeSorterJoinThread(SortSubtask *pTask){
  int rc = SQLITE_OK;
  if( pTask->pThread ){
#ifdef SQLITE_DEBUG_SORTER_THREADS
    int bDone = pTask->bDone;
#endif
    void *pRet = SQLITE_INT_TO_PTR(SQLITE_ERROR);
    vdbeSorterBlockDebug(pTask, !bDone, "enter");
    (void)sqlite3ThreadJoin(pTask->pThread, &pRet);
    vdbeSorterBlockDebug(pTask, !bDone, "exit");
    rc = SQLITE_PTR_TO_INT(pRet);
    assert( pTask->bDone==1 );
    pTask->bDone = 0;
    pTask->pThread = 0;
  }
  return rc;
}